

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 floatx80_sub_tricore(floatx80 a,floatx80 b,float_status *status)

{
  byte zSign;
  floatx80 fVar1;
  
  if ((long)a.low < 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
  {
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 || (long)b.low < 0
       ) {
      zSign = a.high._1_1_ >> 7;
      if ((uint16_t)(a.high >> 0xf) == (uint16_t)(b.high >> 0xf)) {
        fVar1 = subFloatx80Sigs(a,b,zSign,status);
      }
      else {
        fVar1 = addFloatx80Sigs(a,b,zSign,status);
      }
      return fVar1;
    }
  }
  status->float_exception_flags = status->float_exception_flags | 1;
  fVar1._10_6_ = b.low._2_6_;
  fVar1.high = 0xffff;
  fVar1.low = 0xc000000000000000;
  return fVar1;
}

Assistant:

floatx80 floatx80_sub(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, bSign;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSign = extractFloatx80Sign( a );
    bSign = extractFloatx80Sign( b );
    if ( aSign == bSign ) {
        return subFloatx80Sigs(a, b, aSign, status);
    }
    else {
        return addFloatx80Sigs(a, b, aSign, status);
    }

}